

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPExternalTransmitter::GetLocalHostName
          (RTPExternalTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  RTPMemoryManager *mgr;
  uint8_t *puVar4;
  char local_428 [8];
  char name [1024];
  size_t *bufferlength_local;
  uint8_t *buffer_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x96;
  }
  else {
    name._1016_8_ = bufferlength;
    if (this->localhostname == (uint8_t *)0x0) {
      iVar2 = gethostname(local_428,0x3ff);
      if (iVar2 == 0) {
        name[0x3f7] = '\0';
      }
      else {
        strcpy(local_428,"localhost");
      }
      sVar3 = strlen(local_428);
      this->localhostnamelength = sVar3;
      sVar1 = this->localhostnamelength;
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      puVar4 = (uint8_t *)operator_new__(sVar1 + 1,mgr,0);
      this->localhostname = puVar4;
      memcpy(this->localhostname,local_428,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
    }
    if (*(ulong *)name._1016_8_ < this->localhostnamelength) {
      *(size_t *)name._1016_8_ = this->localhostnamelength;
      this_local._4_4_ = -0x45;
    }
    else {
      memcpy(buffer,this->localhostname,this->localhostnamelength);
      *(size_t *)name._1016_8_ = this->localhostnamelength;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		// We'll just use 'gethostname' for simplicity

		char name[1024];

		if (gethostname(name,1023) != 0)
			strcpy(name, "localhost"); // failsafe
		else
			name[1023] = 0; // ensure null-termination

		localhostnamelength = strlen(name);
		localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];

		memcpy(localhostname, name, localhostnamelength);
		localhostname[localhostnamelength] = 0;
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}